

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

void wabt::anon_unknown_1::ResolveTypeNames(Module *module,FuncDeclaration *decl)

{
  pointer pTVar1;
  uint32_t param_index;
  ulong uVar2;
  long lVar3;
  
  if (decl != (FuncDeclaration *)0x0) {
    lVar3 = 0;
    for (uVar2 = 0;
        pTVar1 = (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar2 < ((ulong)((long)(decl->sig).param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pTVar1) >> 3 & 0xffffffff);
        uVar2 = uVar2 + 1) {
      ResolveTypeName(module,(Type *)((long)&pTVar1->enum_ + lVar3),(Index)uVar2,
                      &(decl->sig).param_type_names);
      lVar3 = lVar3 + 8;
    }
    lVar3 = 0;
    for (uVar2 = 0;
        pTVar1 = (decl->sig).result_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar2 < ((ulong)((long)(decl->sig).result_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pTVar1) >> 3 & 0xffffffff);
        uVar2 = uVar2 + 1) {
      ResolveTypeName(module,(Type *)((long)&pTVar1->enum_ + lVar3),(Index)uVar2,
                      &(decl->sig).result_type_names);
      lVar3 = lVar3 + 8;
    }
    return;
  }
  __assert_fail("decl",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                ,0x14b,
                "void wabt::(anonymous namespace)::ResolveTypeNames(const Module &, FuncDeclaration *)"
               );
}

Assistant:

void ResolveTypeNames(const Module& module, FuncDeclaration* decl) {
  assert(decl);
  auto& signature = decl->sig;

  for (uint32_t param_index = 0; param_index < signature.GetNumParams();
       ++param_index) {
    ResolveTypeName(module, signature.param_types[param_index], param_index,
                    signature.param_type_names);
  }

  for (uint32_t result_index = 0; result_index < signature.GetNumResults();
       ++result_index) {
    ResolveTypeName(module, signature.result_types[result_index], result_index,
                    signature.result_type_names);
  }
}